

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_common.cpp
# Opt level: O1

string * pstore::broker::gc_watch_thread::vacuumd_path_abi_cxx11_(void)

{
  string *in_RDI;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  process_file_name_abi_cxx11_();
  pstore::path::posix::dir_name(&local_90,&local_50);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"pstore-vacuumd","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_b0,local_a8 + (long)local_b0);
  local_30._M_len = 1;
  local_30._M_array = &local_70;
  pstore::path::posix::join(in_RDI,&local_90,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

std::string gc_watch_thread::vacuumd_path () {
            using path::dir_name;
            using path::join;
            return join (dir_name (process_file_name ()), vacuumd_name);
        }